

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  
  __s = (char *)mymalloc(0xc);
  builtin_strncpy(__s,"hello world",0xc);
  puts(__s);
  myfree(__s);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    const char* msg = "hello world";
    char *buffer = (char*)mymalloc(strlen(msg) + 1);
    memset(buffer, 0, strlen(msg)+1);
    strncpy(buffer, msg, strlen(msg)+1);
    printf("%s\n", buffer);
    myfree(buffer);
    return 0;
}